

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validatePositive(Result *__return_storage_ptr__,int value,string *name)

{
  pointer pcVar1;
  uint uVar2;
  undefined8 *puVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string err;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  if (0 < value) {
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_002f20ce;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_002f20ce;
      }
      if (uVar5 < 10000) goto LAB_002f20ce;
      uVar7 = uVar7 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_002f20ce:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)__len - (char)(value >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)value >> 0x1f) + (long)local_90),__len,__val);
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < (ulong)(local_88 + local_68)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if ((ulong)(local_88 + local_68) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_70);
      goto LAB_002f215c;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90);
LAB_002f215c:
  local_b0 = &local_a0;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_a0 = *plVar4;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar6;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePositive(const int value, const std::string& name) {
    if (value <= 0 ) {
        std::string err = name + " must be positive, got " + std::to_string(value) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    Result r;
    return r;
}